

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_partset_reg(TCGContext_conflict2 *tcg_ctx,int opsize,TCGv_i32 reg,TCGv_i32 val)

{
  TCGv_i32 pTVar1;
  TCGv_i32 tmp;
  TCGv_i32 val_local;
  TCGv_i32 reg_local;
  int opsize_local;
  TCGContext_conflict2 *tcg_ctx_local;
  
  if (opsize == 0) {
    tcg_gen_andi_i32_m68k(tcg_ctx,reg,reg,-0x100);
    pTVar1 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_ext8u_i32_m68k(tcg_ctx,pTVar1,val);
    tcg_gen_or_i32(tcg_ctx,reg,reg,pTVar1);
    tcg_temp_free_i32(tcg_ctx,pTVar1);
  }
  else if (opsize == 1) {
    tcg_gen_andi_i32_m68k(tcg_ctx,reg,reg,-0x10000);
    pTVar1 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_ext16u_i32_m68k(tcg_ctx,pTVar1,val);
    tcg_gen_or_i32(tcg_ctx,reg,reg,pTVar1);
    tcg_temp_free_i32(tcg_ctx,pTVar1);
  }
  else {
    if (1 < opsize - 2U) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
                 ,0x30e,(char *)0x0);
    }
    tcg_gen_mov_i32(tcg_ctx,reg,val);
  }
  return;
}

Assistant:

static void gen_partset_reg(TCGContext *tcg_ctx, int opsize, TCGv reg, TCGv val)
{
    TCGv tmp;
    switch (opsize) {
    case OS_BYTE:
        tcg_gen_andi_i32(tcg_ctx, reg, reg, 0xffffff00);
        tmp = tcg_temp_new(tcg_ctx);
        tcg_gen_ext8u_i32(tcg_ctx, tmp, val);
        tcg_gen_or_i32(tcg_ctx, reg, reg, tmp);
        tcg_temp_free(tcg_ctx, tmp);
        break;
    case OS_WORD:
        tcg_gen_andi_i32(tcg_ctx, reg, reg, 0xffff0000);
        tmp = tcg_temp_new(tcg_ctx);
        tcg_gen_ext16u_i32(tcg_ctx, tmp, val);
        tcg_gen_or_i32(tcg_ctx, reg, reg, tmp);
        tcg_temp_free(tcg_ctx, tmp);
        break;
    case OS_LONG:
    case OS_SINGLE:
        tcg_gen_mov_i32(tcg_ctx, reg, val);
        break;
    default:
        g_assert_not_reached();
    }
}